

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
* __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
::operator=(ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
            *this,ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
                  *other)

{
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
  *other_local;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
  *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
                *)0x0;
  other->endPtr = (Entry *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }